

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerBorderColorCase::test
          (SamplerBorderColorCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum GVar1;
  GLuint GVar2;
  ScopedLogSection SVar3;
  deBool dVar4;
  TestLog *pTVar5;
  int *piVar6;
  uint *param;
  float *param_00;
  Enum<int,_2UL> EVar7;
  GetNameFunc local_4f8;
  int local_4f0;
  string local_4e8;
  allocator<char> local_4c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  GLenum local_43c;
  GetNameFunc p_Stack_438;
  deUint32 err_3;
  int local_430;
  GetNameFunc local_428;
  int local_420;
  string local_418;
  allocator<char> local_3f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  GLenum local_370;
  undefined1 local_36c [4];
  deUint32 err_2;
  IVec4 icolor;
  Vec4 color_2;
  allocator<char> local_321;
  string local_320;
  ScopedLogSection local_300;
  ScopedLogSection section_3;
  TestLog *local_2e8;
  int local_2e0;
  string local_2d8;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  GLenum local_230;
  undefined1 local_22c [4];
  deUint32 err_1;
  UVec4 color_1;
  allocator<char> local_1f1;
  string local_1f0;
  ScopedLogSection local_1d0;
  ScopedLogSection section_2;
  TestLog *local_1b8;
  int local_1b0;
  string local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  GLenum local_100;
  undefined1 local_fc [4];
  deUint32 err;
  IVec4 color;
  allocator<char> local_c1;
  string local_c0;
  ScopedLogSection local_a0;
  ScopedLogSection section_1;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  ScopedLogSection local_28;
  ScopedLogSection section;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  SamplerBorderColorCase *this_local;
  
  section.m_log = (TestLog *)result;
  if (((this->super_SamplerTest).m_type == QUERY_SAMPLER_PARAM_INTEGER_VEC4) ||
     ((this->super_SamplerTest).m_type == QUERY_SAMPLER_PARAM_FLOAT_VEC4)) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Initial",&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Initial",&local_81);
    tcu::ScopedLogSection::ScopedLogSection(&local_28,pTVar5,&local_48,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    SVar3 = section;
    GVar1 = (this->super_SamplerTest).m_pname;
    GVar2 = (this->super_SamplerTest).m_target;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)&section_1.m_log + 4),0.0,0.0,0.0,0.0);
    StateQueryUtil::verifyStateSamplerParamFloatVec4
              ((ResultCollector *)SVar3.m_log,gl,GVar2,GVar1,(Vec4 *)((long)&section_1.m_log + 4),
               (this->super_SamplerTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_28);
  }
  if ((this->super_SamplerTest).m_type == QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Set",&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(color.m_data + 3),"Set",(allocator<char> *)((long)color.m_data + 0xb));
    tcu::ScopedLogSection::ScopedLogSection(&local_a0,pTVar5,&local_c0,(string *)(color.m_data + 3))
    ;
    std::__cxx11::string::~string((string *)(color.m_data + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)color.m_data + 0xb));
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_fc,0x7fffffff,-2,3,-0x80);
    GVar1 = (this->super_SamplerTest).m_pname;
    GVar2 = (this->super_SamplerTest).m_target;
    piVar6 = tcu::Vector<int,_4>::getPtr((Vector<int,_4> *)local_fc);
    glu::CallLogWrapper::glSamplerParameterIiv(gl,GVar2,GVar1,piVar6);
    do {
      local_100 = glu::CallLogWrapper::glGetError(gl);
      SVar3 = section;
      if (local_100 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"Got Error ",&local_181);
        EVar7 = glu::getErrorStr(local_100);
        section_2.m_log = (TestLog *)EVar7.m_getName;
        local_1b0 = EVar7.m_value;
        local_1b8 = section_2.m_log;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1a8,&local_1b8);
        std::operator+(&local_160,&local_180,&local_1a8);
        std::operator+(&local_140,&local_160,": ");
        std::operator+(&local_120,&local_140,"glSamplerParameterIiv");
        tcu::ResultCollector::fail((ResultCollector *)SVar3.m_log,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator(&local_181);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    StateQueryUtil::verifyStateSamplerParamIntegerVec4
              ((ResultCollector *)section.m_log,gl,(this->super_SamplerTest).m_target,
               (this->super_SamplerTest).m_pname,(IVec4 *)local_fc,(this->super_SamplerTest).m_type)
    ;
    tcu::ScopedLogSection::~ScopedLogSection(&local_a0);
  }
  else if ((this->super_SamplerTest).m_type == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Set",&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(color_1.m_data + 3),"Set",(allocator<char> *)((long)color_1.m_data + 0xb))
    ;
    tcu::ScopedLogSection::ScopedLogSection
              (&local_1d0,pTVar5,&local_1f0,(string *)(color_1.m_data + 3));
    std::__cxx11::string::~string((string *)(color_1.m_data + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)color_1.m_data + 0xb));
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)local_22c,0x8000000,2,3,0x80);
    GVar1 = (this->super_SamplerTest).m_pname;
    GVar2 = (this->super_SamplerTest).m_target;
    param = tcu::Vector<unsigned_int,_4>::getPtr((Vector<unsigned_int,_4> *)local_22c);
    glu::CallLogWrapper::glSamplerParameterIuiv(gl,GVar2,GVar1,param);
    do {
      local_230 = glu::CallLogWrapper::glGetError(gl);
      SVar3 = section;
      if (local_230 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b0,"Got Error ",&local_2b1);
        EVar7 = glu::getErrorStr(local_230);
        section_3.m_log = (TestLog *)EVar7.m_getName;
        local_2e0 = EVar7.m_value;
        local_2e8 = section_3.m_log;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2d8,&local_2e8);
        std::operator+(&local_290,&local_2b0,&local_2d8);
        std::operator+(&local_270,&local_290,": ");
        std::operator+(&local_250,&local_270,"glSamplerParameterIuiv");
        tcu::ResultCollector::fail((ResultCollector *)SVar3.m_log,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator(&local_2b1);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    StateQueryUtil::verifyStateSamplerParamUnsignedIntegerVec4
              ((ResultCollector *)section.m_log,gl,(this->super_SamplerTest).m_target,
               (this->super_SamplerTest).m_pname,(UVec4 *)local_22c,(this->super_SamplerTest).m_type
              );
    tcu::ScopedLogSection::~ScopedLogSection(&local_1d0);
  }
  else {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"Set",&local_321);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(color_2.m_data + 3),"Set",(allocator<char> *)((long)color_2.m_data + 0xb))
    ;
    tcu::ScopedLogSection::ScopedLogSection
              (&local_300,pTVar5,&local_320,(string *)(color_2.m_data + 3));
    std::__cxx11::string::~string((string *)(color_2.m_data + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)color_2.m_data + 0xb));
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(icolor.m_data + 2),0.25,1.0,0.0,0.77);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_36c,0x8000000,0x7fffffff,0,0xfffffff);
    GVar1 = (this->super_SamplerTest).m_pname;
    GVar2 = (this->super_SamplerTest).m_target;
    param_00 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)(icolor.m_data + 2));
    glu::CallLogWrapper::glSamplerParameterfv(gl,GVar2,GVar1,param_00);
    do {
      local_370 = glu::CallLogWrapper::glGetError(gl);
      SVar3 = section;
      if (local_370 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"Got Error ",&local_3f1);
        EVar7 = glu::getErrorStr(local_370);
        p_Stack_438 = EVar7.m_getName;
        local_430 = EVar7.m_value;
        local_428 = p_Stack_438;
        local_420 = local_430;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_418,&local_428);
        std::operator+(&local_3d0,&local_3f0,&local_418);
        std::operator+(&local_3b0,&local_3d0,": ");
        std::operator+(&local_390,&local_3b0,"glSamplerParameterfv");
        tcu::ResultCollector::fail((ResultCollector *)SVar3.m_log,&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    StateQueryUtil::verifyStateSamplerParamFloatVec4
              ((ResultCollector *)section.m_log,gl,(this->super_SamplerTest).m_target,
               (this->super_SamplerTest).m_pname,(Vec4 *)(icolor.m_data + 2),
               (this->super_SamplerTest).m_type);
    GVar1 = (this->super_SamplerTest).m_pname;
    GVar2 = (this->super_SamplerTest).m_target;
    piVar6 = tcu::Vector<int,_4>::getPtr((Vector<int,_4> *)local_36c);
    glu::CallLogWrapper::glSamplerParameteriv(gl,GVar2,GVar1,piVar6);
    do {
      local_43c = glu::CallLogWrapper::glGetError(gl);
      SVar3 = section;
      if (local_43c != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4c0,"Got Error ",&local_4c1);
        EVar7 = glu::getErrorStr(local_43c);
        local_4f8 = EVar7.m_getName;
        local_4f0 = EVar7.m_value;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_4e8,&local_4f8);
        std::operator+(&local_4a0,&local_4c0,&local_4e8);
        std::operator+(&local_480,&local_4a0,": ");
        std::operator+(&local_460,&local_480,"glSamplerParameteriv");
        tcu::ResultCollector::fail((ResultCollector *)SVar3.m_log,&local_460);
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::allocator<char>::~allocator(&local_4c1);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    StateQueryUtil::verifyStateSamplerParamNormalizedI32Vec4
              ((ResultCollector *)section.m_log,gl,(this->super_SamplerTest).m_target,
               (this->super_SamplerTest).m_pname,(IVec4 *)local_36c,(this->super_SamplerTest).m_type
              );
    tcu::ScopedLogSection::~ScopedLogSection(&local_300);
  }
  return;
}

Assistant:

void SamplerBorderColorCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	// border color is undefined if queried with pure type and was not set to pure value
	if (m_type == QUERY_SAMPLER_PARAM_INTEGER_VEC4 || m_type == QUERY_SAMPLER_PARAM_FLOAT_VEC4)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamFloatVec4(result, gl, m_target, m_pname, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), m_type);
	}

	if (m_type == QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::IVec4			color			(0x7FFFFFFF, -2, 3, -128);

		gl.glSamplerParameterIiv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");

		verifyStateSamplerParamIntegerVec4(result, gl, m_target, m_pname, color, m_type);
	}
	else if (m_type == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::UVec4			color			(0x8000000ul, 2, 3, 128);

		gl.glSamplerParameterIuiv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");

		verifyStateSamplerParamUnsignedIntegerVec4(result, gl, m_target, m_pname, color, m_type);
	}
	else
	{
		DE_ASSERT(m_type == QUERY_SAMPLER_PARAM_INTEGER_VEC4 || m_type == QUERY_SAMPLER_PARAM_FLOAT_VEC4);

		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::Vec4				color			(0.25f, 1.0f, 0.0f, 0.77f);
		const tcu::IVec4			icolor			(0x8000000ul, 0x7FFFFFFF, 0, 0x0FFFFFFF);

		gl.glSamplerParameterfv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterfv");

		verifyStateSamplerParamFloatVec4(result, gl, m_target, m_pname, color, m_type);

		gl.glSamplerParameteriv(m_target, m_pname, icolor.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteriv");

		verifyStateSamplerParamNormalizedI32Vec4(result, gl, m_target, m_pname, icolor, m_type);
	}
}